

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O0

ptls_cipher_context_t *
ptls_ffx_new(ptls_cipher_algorithm_t *algo,int is_enc,int nb_rounds,size_t bit_length,void *key)

{
  int iVar1;
  undefined8 local_30;
  ptls_cipher_context_t *ctx;
  void *key_local;
  size_t bit_length_local;
  int nb_rounds_local;
  int is_enc_local;
  ptls_cipher_algorithm_t *algo_local;
  
  local_30 = (ptls_cipher_context_t *)malloc(0x60);
  if (local_30 != (ptls_cipher_context_t *)0x0) {
    memset(local_30,0,0x60);
    iVar1 = ptls_ffx_setup_crypto(local_30,algo,is_enc,nb_rounds,bit_length,key);
    if (iVar1 != 0) {
      free(local_30);
      local_30 = (ptls_cipher_context_t *)0x0;
    }
  }
  return local_30;
}

Assistant:

ptls_cipher_context_t *ptls_ffx_new(ptls_cipher_algorithm_t *algo, int is_enc, int nb_rounds, size_t bit_length, const void *key)
{
    ptls_cipher_context_t *ctx = (ptls_cipher_context_t *)malloc(sizeof(ptls_ffx_context_t));

    if (ctx != NULL) {
        memset(ctx, 0, sizeof(ptls_ffx_context_t));
        if (ptls_ffx_setup_crypto(ctx, algo, is_enc, nb_rounds, bit_length, key) != 0) {
            free(ctx);
            ctx = NULL;
        }
    }

    return ctx;
}